

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

bool __thiscall minibag::Player::pauseCallback(Player *this,Request *req,Response *res)

{
  _data_type _Var1;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  _Var1 = req->data;
  this->requested_pause_state_ = _Var1 != '\0';
  bVar4 = (bool)_Var1 == this->paused_;
  this->pause_change_requested_ = !bVar4;
  res->success = !bVar4;
  local_60[0] = local_50;
  if (bVar4) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Bag is already ","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_60);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Playback is now ","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_60);
  }
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_30 = *plVar3;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&res->message,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return true;
}

Assistant:

bool Player::pauseCallback(std_srvs::SetBool::Request &req, std_srvs::SetBool::Response &res)
{
  pause_change_requested_ = (req.data != paused_);
  requested_pause_state_ = req.data;

  res.success = pause_change_requested_;

  if (res.success)
  {
    res.message = std::string("Playback is now ") + (requested_pause_state_ ? "paused" : "resumed");
  }
  else
  {
    res.message = std::string("Bag is already ") + (requested_pause_state_ ? "paused." : "running.");
  }

  return true;
}